

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O3

string * __thiscall
Control::toStr_abi_cxx11_(string *__return_storage_ptr__,Control *this,Network *nw)

{
  ostream *poVar1;
  int seconds;
  int seconds_00;
  char *pcVar2;
  long lVar3;
  stringstream local_1e0 [8];
  stringstream s;
  ostream local_1d0 [112];
  ios_base local_160 [264];
  Network *local_58;
  string local_50;
  
  local_58 = nw;
  std::__cxx11::stringstream::stringstream(local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1d0,"Link ",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1d0,(this->link->super_Element).name._M_dataplus._M_p,
                      (this->link->super_Element).name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = local_1d0;
  if (this->status == 1) {
    lVar3 = 4;
    pcVar2 = "OPEN";
  }
  else if (this->status == 0) {
    lVar3 = 6;
    pcVar2 = "CLOSED";
  }
  else {
    pcVar2 = " ";
    lVar3 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(local_1d0," ",1);
    poVar1 = std::ostream::_M_insert<double>(this->setting);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,lVar3);
  switch(*(undefined4 *)&(this->super_Element).field_0x2c) {
  case 0:
    std::__ostream_insert<char,std::char_traits<char>>(local_1d0," IF NODE ",9);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1d0,(this->node->super_Element).name._M_dataplus._M_p,
                        (this->node->super_Element).name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    pcVar2 = "ABOVE";
    if (this->levelType == LOW_LEVEL) {
      pcVar2 = "BELOW";
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1d0,pcVar2,5);
    lVar3 = 200;
    std::__ostream_insert<char,std::char_traits<char>>(local_1d0," ",1);
    break;
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>(local_1d0," IF NODE ",9);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1d0,(this->node->super_Element).name._M_dataplus._M_p,
                        (this->node->super_Element).name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    pcVar2 = "ABOVE";
    if (this->levelType == LOW_LEVEL) {
      pcVar2 = "BELOW";
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1d0,pcVar2,5);
    lVar3 = 0xe0;
    std::__ostream_insert<char,std::char_traits<char>>(local_1d0," ",1);
    break;
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>(local_1d0," AT TIME ",9);
    Utilities::getTime_abi_cxx11_(&local_50,(Utilities *)(ulong)(uint)this->time,seconds);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1d0,local_50._M_dataplus._M_p,local_50._M_string_length);
    goto LAB_0012ba6b;
  case 3:
    std::__ostream_insert<char,std::char_traits<char>>(local_1d0," AT CLOCKTIME ",0xe);
    Utilities::getTime_abi_cxx11_(&local_50,(Utilities *)(ulong)(uint)this->time,seconds_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1d0,local_50._M_dataplus._M_p,local_50._M_string_length);
LAB_0012ba6b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  default:
    goto switchD_0012b986_default;
  }
  std::ostream::_M_insert<double>
            ((this->head - this->node->elev) *
             *(double *)
              ((long)&(local_58->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar3));
switchD_0012b986_default:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1e0);
  std::ios_base::~ios_base(local_160);
  return __return_storage_ptr__;
}

Assistant:

string Control::toStr(Network* nw)
{
    // ... write Link name and its control action

    stringstream s;
    s << "Link " << link->name << " ";
    if ( status == CLOSED_STATUS )    s << "CLOSED";
    else if ( status == OPEN_STATUS ) s << "OPEN";
    else s << " " << setting << " ";

    // ... write node condition or time causing the action

    switch (type)
    {
    case TANK_LEVEL:
        s << " IF NODE " << node->name << " ";
        if ( levelType == LOW_LEVEL ) s << "BELOW";
        else s << "ABOVE";
        s << " " << (head - node->elev) * nw->ucf(Units::LENGTH);
        break;

    case PRESSURE_LEVEL:
        s << " IF NODE " << node->name << " ";
        if ( levelType == LOW_LEVEL ) s << "BELOW";
        else s << "ABOVE";
        s << " " << (head - node->elev) * nw->ucf(Units::PRESSURE);
        break;

    case ELAPSED_TIME:
        s << " AT TIME " <<  Utilities::getTime(time);
        break;

    case TIME_OF_DAY:
        s << " AT CLOCKTIME " << Utilities::getTime(time);
        break;
    }
    return s.str();
}